

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DistItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DistItemSyntax,slang::syntax::ExpressionSyntax&,slang::syntax::DistWeightSyntax*&>
          (BumpAllocator *this,ExpressionSyntax *args,DistWeightSyntax **args_1)

{
  DistItemSyntax *this_00;
  DistWeightSyntax **args_local_1;
  ExpressionSyntax *args_local;
  BumpAllocator *this_local;
  
  this_00 = (DistItemSyntax *)allocate(this,0x20,8);
  slang::syntax::DistItemSyntax::DistItemSyntax(this_00,args,*args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }